

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
               (Nonzero<double> *keys,int end,IdxCompare *compare,int start)

{
  double dVar1;
  int iVar2;
  int a;
  int iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  lVar6 = 2;
  do {
    iVar2 = SPxShellsort<soplex::Nonzero<double>,_soplex::SPxMainSM<double>::IdxCompare>::incs
            [lVar6];
    lVar7 = (long)start + (long)iVar2;
    lVar9 = lVar7;
    iVar8 = start;
    if ((int)lVar7 <= end) {
      do {
        dVar1 = keys[lVar9].val;
        a = keys[lVar9].idx;
        iVar5 = (int)lVar9;
        iVar3 = iVar8;
        if (lVar7 <= lVar9) {
          do {
            bVar4 = EQ(a,keys[iVar3].idx);
            iVar5 = iVar3;
            if ((bVar4) || (keys[iVar3].idx <= a)) break;
            keys[iVar2 + iVar3].idx = keys[iVar3].idx;
            keys[iVar2 + iVar3].val = keys[iVar3].val;
            iVar5 = iVar3 - iVar2;
            bVar4 = (int)lVar7 <= iVar3;
            iVar3 = iVar5;
          } while (bVar4);
          iVar5 = iVar5 + iVar2;
        }
        keys[iVar5].val = dVar1;
        keys[iVar5].idx = a;
        lVar9 = lVar9 + 1;
        iVar8 = iVar8 + 1;
      } while (end + 1 != (int)lVar9);
    }
    bVar4 = lVar6 == 0;
    lVar6 = lVar6 + -1;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}